

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

GCstr * lex_str(LexState *ls)

{
  uint uVar1;
  
  if ((ls->tok != 0x10a) && (ls->tok != 0x11f)) {
    err_token(ls,0x11f);
  }
  uVar1 = (ls->tokval).u32.lo;
  lj_lex_next(ls);
  return (GCstr *)(ulong)uVar1;
}

Assistant:

static GCstr *lex_str(LexState *ls)
{
  GCstr *s;
  if (ls->tok != TK_name && (LJ_52 || ls->tok != TK_goto))
    err_token(ls, TK_name);
  s = strV(&ls->tokval);
  lj_lex_next(ls);
  return s;
}